

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_decimal<int>(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                   *this,int value)

{
  int iVar1;
  type pcVar2;
  uint32_t n;
  
  n = -value;
  if (0 < value) {
    n = value;
  }
  iVar1 = internal::count_digits(n);
  pcVar2 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                     (&this->out_,(ulong)((uint)value >> 0x1f) + (long)iVar1);
  if (value < 0) {
    *pcVar2 = '-';
    pcVar2 = pcVar2 + 1;
  }
  internal::format_decimal<char,unsigned_int,char*,fmt::v5::internal::no_thousands_sep>
            (pcVar2,n,iVar1);
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }